

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisRegular.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::GridAxisRegular::Encode(GridAxisRegular *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  GridAxisRegular *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,(double)this->m_f64DomainInitialXi);
  pKVar1 = KDataStream::operator<<(pKVar1,(double)this->m_f64DomainFinalXi);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16DomainPointsXi);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8InterleafFactor);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8AxisType);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16NumPoints);
  KDataStream::operator<<(pKVar1,this->m_ui16InitialIndex);
  return;
}

Assistant:

void GridAxisRegular::Encode( KDataStream & stream ) const
{
    stream << m_f64DomainInitialXi
           << m_f64DomainFinalXi
           << m_ui16DomainPointsXi
           << m_ui8InterleafFactor
           << m_ui8AxisType
           << m_ui16NumPoints
           << m_ui16InitialIndex;
}